

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * parse_context_statement(dmr_C *C,token *token,statement *stmt)

{
  symbol *psVar1;
  token *ptVar2;
  expression *expr;
  statement *stmt_local;
  token *token_local;
  dmr_C *C_local;
  
  stmt->type = STMT_CONTEXT;
  ptVar2 = dmrC_parse_expression(C,token->next,(expression **)&(stmt->field_2).field_0);
  if ((((undefined1  [64])
        ((undefined1  [64])*(stmt->field_2).field_1.expression & (undefined1  [64])0xff) ==
        (undefined1  [64])0x9) && (((stmt->field_2).field_1.expression)->op == 0x28)) &&
     ((((stmt->field_2).field_4.stmts)->list_[0]->type & 0xff) == 0x15)) {
    psVar1 = ((stmt->field_2).field_5.label_identifier)->next_id;
    (stmt->field_2).field_1.context = (expression *)psVar1->next_id;
    (stmt->field_2).field_0.declaration = (symbol_list *)psVar1->replace;
  }
  ptVar2 = dmrC_expect_token(C,ptVar2,0x3b,"at end of statement");
  return ptVar2;
}

Assistant:

static struct token *parse_context_statement(struct dmr_C *C, struct token *token, struct statement *stmt)
{
	stmt->type = STMT_CONTEXT;
	token = dmrC_parse_expression(C, token->next, &stmt->expression);
	if (stmt->expression->type == EXPR_PREOP
	    && stmt->expression->op == '('
	    && stmt->expression->unop->type == EXPR_COMMA) {
		struct expression *expr;
		expr = stmt->expression->unop;
		stmt->context = expr->left;
		stmt->expression = expr->right;
	}
	return dmrC_expect_token(C, token, ';', "at end of statement");
}